

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

void __thiscall mkvparser::Tags::~Tags(Tags *this)

{
  Tag *pTVar1;
  uint uVar2;
  
  while( true ) {
    pTVar1 = this->m_tags;
    if (this->m_tags_count < 1) break;
    uVar2 = this->m_tags_count - 1;
    this->m_tags_count = uVar2;
    Tag::Clear(pTVar1 + uVar2);
  }
  if (pTVar1 != (Tag *)0x0) {
    operator_delete__(&pTVar1[-1].m_simple_tags_size);
    return;
  }
  return;
}

Assistant:

Tags::~Tags() {
  while (m_tags_count > 0) {
    Tag& t = m_tags[--m_tags_count];
    t.Clear();
  }
  delete[] m_tags;
}